

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateAccessChainToVar
          (InterfaceVariableScalarReplacement *this,uint32_t var_type_id,Instruction *var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *index_ids,Instruction *insert_before,
          uint32_t *component_type_id)

{
  IRContext *pIVar1;
  _Type *pacVar2;
  uint32_t uVar3;
  StorageClass storage_class;
  uint32_t uVar4;
  Instruction *this_00;
  _Type *pacVar5;
  undefined1 local_c0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a0;
  undefined1 local_98 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  DefUseManager *local_60;
  Instruction *local_58;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pIVar1 = (this->super_Pass).context_;
  local_58 = insert_before;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  local_60 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_68 = index_ids;
  uVar3 = anon_unknown_0::GetComponentTypeOfArrayMatrix
                    (local_60,var_type_id,
                     (uint32_t)
                     ((ulong)((long)(index_ids->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(index_ids->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  *component_type_id = uVar3;
  uVar4 = (var->has_result_id_ & 1) + 1;
  if (var->has_type_id_ == false) {
    uVar4 = (uint)var->has_result_id_;
  }
  storage_class = Instruction::GetSingleWordOperand(var,uVar4);
  uVar4 = GetPointerType(this,uVar3,storage_class);
  this_00 = (Instruction *)operator_new(0x70);
  pIVar1 = (this->super_Pass).context_;
  uVar3 = Pass::TakeNextId(&this->super_Pass);
  local_c0[0x10] = '\0';
  local_c0[0x11] = '\0';
  local_c0[0x12] = '\0';
  local_c0[0x13] = '\0';
  if (var->has_result_id_ == true) {
    local_c0._16_4_ = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_c0._24_8_ = local_c0 + 0x10;
  local_c0._0_8_ = &PTR__SmallVector_00b02ef8;
  local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c0._8_8_ = 1;
  local_98._0_4_ = SPV_OPERAND_TYPE_ID;
  local_98._8_8_ = &PTR__SmallVector_00b02ef8;
  local_98._16_8_ = 0;
  local_98._32_8_ = local_98 + 0x18;
  local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_c0);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_98,&local_68);
  Instruction::Instruction(this_00,pIVar1,OpAccessChain,uVar4,uVar3,(OperandList *)&local_48);
  local_50._M_head_impl = this_00;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  local_98._8_8_ = &PTR__SmallVector_00b02ef8;
  if (local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_70,local_70._M_head_impl);
  }
  local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c0._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_a0,local_a0._M_head_impl);
  }
  pacVar5 = (_Type *)(local_68->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
  pacVar2 = (_Type *)(local_68->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
  if (pacVar5 != pacVar2) {
    do {
      local_c0._16_4_ = *pacVar5;
      local_c0._0_8_ = &PTR__SmallVector_00b02ef8;
      local_c0._24_8_ = local_c0 + 0x10;
      local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_c0._8_8_ = 1;
      local_98._0_4_ = SPV_OPERAND_TYPE_ID;
      local_98._8_8_ = &PTR__SmallVector_00b02ef8;
      local_98._16_8_ = 0;
      local_98._32_8_ = local_98 + 0x18;
      local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_c0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&this_00->operands_,(Operand *)local_98);
      local_98._8_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_70,local_70._M_head_impl);
      }
      local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_c0._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_a0,local_a0._M_head_impl);
      }
      pacVar5 = pacVar5 + 1;
    } while (pacVar5 != pacVar2);
  }
  analysis::DefUseManager::AnalyzeInstDefUse(local_60,this_00);
  Instruction::InsertBefore
            (local_58,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       *)&local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*((local_50._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return this_00;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateAccessChainToVar(
    uint32_t var_type_id, Instruction* var,
    const std::vector<uint32_t>& index_ids, Instruction* insert_before,
    uint32_t* component_type_id) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  *component_type_id = GetComponentTypeOfArrayMatrix(
      def_use_mgr, var_type_id, static_cast<uint32_t>(index_ids.size()));

  uint32_t ptr_type_id =
      GetPointerType(*component_type_id, GetStorageClass(var));

  std::unique_ptr<Instruction> new_access_chain(new Instruction(
      context(), spv::Op::OpAccessChain, ptr_type_id, TakeNextId(),
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
  for (uint32_t index_id : index_ids) {
    new_access_chain->AddOperand({SPV_OPERAND_TYPE_ID, {index_id}});
  }

  Instruction* inst = new_access_chain.get();
  def_use_mgr->AnalyzeInstDefUse(inst);
  insert_before->InsertBefore(std::move(new_access_chain));
  return inst;
}